

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_0::AsyncifyFlow::create(AsyncifyFlow *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  long in_RSI;
  
  pp_Var3 = (_func_int **)operator_new(0x98);
  p_Var1 = *(_func_int **)(in_RSI + 0x58);
  p_Var2 = *(_func_int **)(in_RSI + 0x70);
  pp_Var3[1] = (_func_int *)0x0;
  pp_Var3[2] = (_func_int *)(pp_Var3 + 4);
  pp_Var3[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 4) = 0;
  *(undefined1 *)(pp_Var3 + 10) = 0;
  *pp_Var3 = (_func_int *)&PTR__AsyncifyFlow_010915d8;
  pp_Var3[0xb] = p_Var1;
  p_Var1 = *(_func_int **)(in_RSI + 0x68);
  pp_Var3[0xc] = *(_func_int **)(in_RSI + 0x60);
  pp_Var3[0xd] = p_Var1;
  pp_Var3[0xe] = p_Var2;
  pp_Var3[0xf] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var3 + 0x12) = 0;
  (this->super_Pass)._vptr_Pass = pp_Var3;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<AsyncifyFlow>(
      analyzer, pointerType, asyncifyMemory);
  }